

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usage.cc
# Opt level: O1

void __thiscall absl::SetProgramUsageMessage(absl *this,string_view new_usage_message)

{
  string *psVar1;
  char *absl_raw_log_internal_filename;
  int local_28 [2];
  char *local_20;
  
  Mutex::Lock((Mutex *)&flags_internal::(anonymous_namespace)::usage_message_guard);
  if (flags_internal::(anonymous_namespace)::program_usage_message_abi_cxx11_ == (string *)0x0) {
    psVar1 = (string *)operator_new(0x20);
    *(string **)psVar1 = psVar1 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              (psVar1,new_usage_message._M_len,this + new_usage_message._M_len);
    flags_internal::(anonymous_namespace)::program_usage_message_abi_cxx11_ = psVar1;
    Mutex::Unlock((Mutex *)&flags_internal::(anonymous_namespace)::usage_message_guard);
    return;
  }
  local_20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/flags/usage.cc"
  ;
  local_28[1] = 3;
  local_28[0] = 0x2e;
  base_internal::AtomicHook<void(*)(absl::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
  ::operator()((AtomicHook<void(*)(absl::LogSeverity,char_const*,int,std::__cxx11::string_const&)> *
               )&raw_log_internal::internal_log_function_abi_cxx11_,(LogSeverity *)(local_28 + 1),
               &local_20,local_28,(char (*) [39])"SetProgramUsageMessage() called twice.");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/flags/usage.cc"
                ,0x2e,"void absl::SetProgramUsageMessage(absl::string_view)");
}

Assistant:

void SetProgramUsageMessage(absl::string_view new_usage_message) {
  absl::MutexLock l(&flags_internal::usage_message_guard);

  if (flags_internal::program_usage_message != nullptr) {
    ABSL_INTERNAL_LOG(FATAL, "SetProgramUsageMessage() called twice.");
    std::exit(1);
  }

  flags_internal::program_usage_message = new std::string(new_usage_message);
}